

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

optional_ptr<const_duckdb::ConfigurationOption,_true>
duckdb::DBConfig::GetOptionByName(string *name)

{
  bool bVar1;
  undefined **ppuVar2;
  string lname;
  string local_30;
  
  StringUtil::Lower(&local_30,(string *)name);
  ppuVar2 = &PTR__ChunkScanState_027bb280;
  do {
    if (((ConfigurationOption *)((long)ppuVar2 + 0x40))->name == (char *)0x0) {
      ppuVar2 = (undefined **)0x0;
      break;
    }
    bVar1 = ::std::operator==(((ConfigurationOption *)((long)ppuVar2 + 0x40))->name,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_30);
    ppuVar2 = (undefined **)((long)ppuVar2 + 0x40);
  } while (!bVar1);
  ::std::__cxx11::string::~string((string *)&local_30);
  return (optional_ptr<const_duckdb::ConfigurationOption,_true>)(ConfigurationOption *)ppuVar2;
}

Assistant:

optional_ptr<const ConfigurationOption> DBConfig::GetOptionByName(const string &name) {
	auto lname = StringUtil::Lower(name);
	for (idx_t index = 0; internal_options[index].name; index++) {
		D_ASSERT(StringUtil::Lower(internal_options[index].name) == string(internal_options[index].name));
		if (internal_options[index].name == lname) {
			return internal_options + index;
		}
	}
	return nullptr;
}